

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RankPreservingReshapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_rankpreservingreshape(NeuralNetworkLayer *this)

{
  bool bVar1;
  RankPreservingReshapeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_rankpreservingreshape(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_rankpreservingreshape(this);
    this_00 = (RankPreservingReshapeLayerParams *)operator_new(0x28);
    RankPreservingReshapeLayerParams::RankPreservingReshapeLayerParams(this_00);
    (this->layer_).rankpreservingreshape_ = this_00;
  }
  return (RankPreservingReshapeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RankPreservingReshapeLayerParams* NeuralNetworkLayer::mutable_rankpreservingreshape() {
  if (!has_rankpreservingreshape()) {
    clear_layer();
    set_has_rankpreservingreshape();
    layer_.rankpreservingreshape_ = new ::CoreML::Specification::RankPreservingReshapeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.rankPreservingReshape)
  return layer_.rankpreservingreshape_;
}